

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testValidCrop2(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_long> *this;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this_00;
  Type *this_01;
  LayerUnion this_02;
  WeightParams *pWVar10;
  ShapeConstraint *pSVar11;
  ShapeRange *pSVar12;
  size_t sVar13;
  ostream *poVar14;
  Rep *pRVar15;
  int iVar16;
  int iVar17;
  RangeValue RVar18;
  Model m1;
  NeuralNetworkShaper shaper;
  Result res;
  string local_118;
  RangeValue local_f8;
  Model local_e8;
  undefined1 local_b8 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_e8);
  if (local_e8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e8.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_b8 + 0x10;
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b8);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar17 = (pAVar9->shape_).current_size_;
  iVar16 = (pAVar9->shape_).total_size_;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 1);
    iVar17 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
  }
  pRVar15 = (pAVar9->shape_).rep_;
  iVar5 = iVar17 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar15->elements[iVar17] = 1;
  if (iVar5 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  iVar17 = iVar5 + 1;
  pRVar1->current_size_ = iVar17;
  pRVar15->elements[iVar5] = 0xea;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar17 = (pAVar9->shape_).current_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar17 + 1;
  pRVar15->elements[iVar17] = 0x14c;
  if (local_e8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e8.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b8);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar17 = (pAVar9->shape_).current_size_;
  iVar16 = (pAVar9->shape_).total_size_;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 1);
    iVar17 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
  }
  pRVar15 = (pAVar9->shape_).rep_;
  iVar5 = iVar17 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar15->elements[iVar17] = 2;
  if (iVar5 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  iVar17 = iVar5 + 1;
  pRVar1->current_size_ = iVar17;
  pRVar15->elements[iVar5] = 10;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar17 = (pAVar9->shape_).current_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar17 + 1;
  pRVar15->elements[iVar17] = 0xb;
  if (local_e8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b8);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (local_e8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_e8);
    local_e8._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_e8.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_e8.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] == 0xbe) {
    this_02 = this_01->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0xbe;
    this_02.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::CropLayerParams::CropLayerParams(this_02.crop_);
    (this_01->layer_).crop_ = (CropLayerParams *)this_02;
  }
  this = &(this_02.convolution_)->kernelsize_;
  iVar17 = ((this_02.convolution_)->kernelsize_).current_size_;
  iVar16 = ((this_02.convolution_)->kernelsize_).total_size_;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this,iVar17 + 1);
    iVar17 = ((this_02.convolution_)->kernelsize_).current_size_;
    iVar16 = ((this_02.convolution_)->kernelsize_).total_size_;
  }
  pWVar10 = (this_02.innerproduct_)->bias_;
  iVar5 = iVar17 + 1;
  ((this_02.convolution_)->kernelsize_).current_size_ = iVar5;
  (&pWVar10->_internal_metadata_)[iVar17].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  if (iVar5 == iVar16) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this,iVar17 + 2);
    iVar5 = ((this_02.convolution_)->kernelsize_).current_size_;
    pWVar10 = (this_02.innerproduct_)->bias_;
  }
  this->current_size_ = iVar5 + 1;
  (&pWVar10->_internal_metadata_)[iVar5].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x2;
  CoreML::validate<(MLModelType)500>(&local_50,&local_e8);
  bVar4 = CoreML::Result::good(&local_50);
  if (!bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe93);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    iVar17 = 1;
    std::ostream::flush();
    goto LAB_0017e058;
  }
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper((NeuralNetworkShaper *)local_b8,&local_e8,true);
  bVar4 = CoreML::NeuralNetworkShaper::isValid((NeuralNetworkShaper *)local_b8);
  if (bVar4) {
    paVar3 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"probs","");
    pSVar11 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b8,&local_118);
    pSVar12 = CoreML::ShapeConstraint::channelRange(pSVar11);
    RVar18 = CoreML::ShapeRange::minimum(pSVar12);
    local_f8._val = RVar18._val;
    local_f8._isUnbound = RVar18._isUnbound;
    sVar13 = CoreML::RangeValue::value(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (sVar13 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"shaper.shape(\"probs\").channelRange().minimum().value() == 1",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      goto LAB_0017e029;
    }
    local_118._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"probs","");
    pSVar11 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b8,&local_118);
    pSVar12 = CoreML::ShapeConstraint::channelRange(pSVar11);
    RVar18 = CoreML::ShapeRange::maximum(pSVar12);
    local_f8._val = RVar18._val;
    local_f8._isUnbound = RVar18._isUnbound;
    sVar13 = CoreML::RangeValue::value(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (sVar13 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"shaper.shape(\"probs\").channelRange().maximum().value() == 1",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      goto LAB_0017e029;
    }
    local_118._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"probs","");
    pSVar11 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b8,&local_118);
    pSVar12 = CoreML::ShapeConstraint::heightRange(pSVar11);
    RVar18 = CoreML::ShapeRange::minimum(pSVar12);
    local_f8._val = RVar18._val;
    local_f8._isUnbound = RVar18._isUnbound;
    sVar13 = CoreML::RangeValue::value(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (sVar13 != 10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"shaper.shape(\"probs\").heightRange().minimum().value() == 10",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      goto LAB_0017e029;
    }
    local_118._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"probs","");
    pSVar11 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b8,&local_118);
    pSVar12 = CoreML::ShapeConstraint::heightRange(pSVar11);
    RVar18 = CoreML::ShapeRange::maximum(pSVar12);
    local_f8._val = RVar18._val;
    local_f8._isUnbound = RVar18._isUnbound;
    sVar13 = CoreML::RangeValue::value(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (sVar13 == 10) {
      local_118._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"probs","");
      pSVar11 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b8,&local_118);
      pSVar12 = CoreML::ShapeConstraint::widthRange(pSVar11);
      RVar18 = CoreML::ShapeRange::minimum(pSVar12);
      local_f8._val = RVar18._val;
      local_f8._isUnbound = RVar18._isUnbound;
      sVar13 = CoreML::RangeValue::value(&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar3) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (sVar13 != 0xb) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"shaper.shape(\"probs\").widthRange().minimum().value() == 11",0x3a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        goto LAB_0017e19a;
      }
      local_118._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"probs","");
      pSVar11 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b8,&local_118);
      pSVar12 = CoreML::ShapeConstraint::widthRange(pSVar11);
      RVar18 = CoreML::ShapeRange::maximum(pSVar12);
      local_f8._val = RVar18._val;
      local_f8._isUnbound = RVar18._isUnbound;
      sVar13 = CoreML::RangeValue::value(&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar3) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      iVar17 = 0;
      if (sVar13 != 0xb) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"shaper.shape(\"probs\").widthRange().maximum().value() == 11",0x3a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        goto LAB_0017e19a;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"shaper.shape(\"probs\").heightRange().maximum().value() == 10",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
LAB_0017e19a:
      iVar17 = 1;
      std::endl<char,std::char_traits<char>>(poVar14);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe96);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"shaper.isValid()",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
LAB_0017e029:
    std::ostream::put((char)poVar14);
    iVar17 = 1;
    std::ostream::flush();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  ::~_Rb_tree(&local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)(local_b8 + 8));
LAB_0017e058:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_e8);
  return iVar17;
}

Assistant:

int testValidCrop2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(234);
    shape->add_shape(332);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);
    shape2->add_shape(10);
    shape2->add_shape(11);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);
    params->add_offset(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    NeuralNetworkShaper shaper(m1);
    ML_ASSERT(shaper.isValid());

    ML_ASSERT(shaper.shape("probs").channelRange().minimum().value() == 1);
    ML_ASSERT(shaper.shape("probs").channelRange().maximum().value() == 1);

    ML_ASSERT(shaper.shape("probs").heightRange().minimum().value() == 10);
    ML_ASSERT(shaper.shape("probs").heightRange().maximum().value() == 10);

    ML_ASSERT(shaper.shape("probs").widthRange().minimum().value() == 11);
    ML_ASSERT(shaper.shape("probs").widthRange().maximum().value() == 11);

    return 0;
}